

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueConvert(defV *val,DataType newType)

{
  __index_type _Var1;
  ulong uVar2;
  double value;
  NamedPoint local_48;
  pointer local_20;
  
  _Var1 = (val->
          super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
          ).
          super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          ._M_index;
  switch(newType) {
  case HELICS_DOUBLE:
    if (_Var1 != '\0') {
      local_48.name._M_dataplus._M_p = (pointer)0x0;
      valueExtract<double>(val,(double *)&local_48);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                   *)val,(double *)&local_48);
    }
    break;
  case HELICS_INT:
    if (_Var1 != '\x01') {
      local_48.name._M_dataplus._M_p = (pointer)0x0;
      valueExtract<long>(val,(long *)&local_48);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                   *)val,(long *)&local_48);
    }
    break;
  case HELICS_COMPLEX:
    if (_Var1 != '\x03') {
      local_48.name._M_dataplus._M_p = (pointer)0x0;
      local_48.name._M_string_length = 0;
      valueExtract(val,(complex<double> *)&local_48);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                   *)val,(complex<double> *)&local_48);
    }
    break;
  case HELICS_VECTOR:
    if (_Var1 == '\x04') {
      return;
    }
    local_48.name._M_dataplus._M_p = (pointer)0x0;
    local_48.name._M_string_length = 0;
    local_48.name.field_2._M_allocated_capacity = 0;
    valueExtract(val,(vector<double,_std::allocator<double>_> *)&local_48);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,(vector<double,_std::allocator<double>_> *)&local_48);
    goto LAB_001fad87;
  case HELICS_COMPLEX_VECTOR:
    if (_Var1 == '\x05') {
      return;
    }
    local_48.name._M_dataplus._M_p = (pointer)0x0;
    local_48.name._M_string_length = 0;
    local_48.name.field_2._M_allocated_capacity = 0;
    valueExtract(val,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                     &local_48);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       &local_48);
LAB_001fad87:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.name._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar2 = local_48.name.field_2._M_allocated_capacity - (long)local_48.name._M_dataplus._M_p;
LAB_001fade9:
      operator_delete(local_48.name._M_dataplus._M_p,uVar2);
    }
    break;
  case HELICS_NAMED_POINT:
    if (_Var1 == '\x06') {
      return;
    }
    local_48.name._M_dataplus._M_p = (pointer)&local_48.name.field_2;
    local_48.name._M_string_length = 0;
    local_48.name.field_2._M_allocated_capacity =
         (ulong)(uint7)local_48.name.field_2._M_allocated_capacity._1_7_ << 8;
    local_48.value = NAN;
    valueExtract(val,&local_48);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,&local_48);
    goto LAB_001fadd9;
  case HELICS_TIME:
    if (_Var1 != '\x01') {
      local_48.name._M_dataplus._M_p = (pointer)0x0;
      valueExtract(val,(Time *)&local_48);
      local_20 = local_48.name._M_dataplus._M_p;
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                   *)val,(long *)&local_20);
    }
    break;
  default:
    if (newType == HELICS_JSON) {
      return;
    }
  case HELICS_BOOL:
    if (_Var1 == '\x02') {
      return;
    }
    local_48.name._M_dataplus._M_p = (pointer)&local_48.name.field_2;
    local_48.name._M_string_length = 0;
    local_48.name.field_2._M_allocated_capacity =
         (ulong)(uint7)local_48.name.field_2._M_allocated_capacity._1_7_ << 8;
    valueExtract(val,&local_48.name);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,&local_48.name);
LAB_001fadd9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.name._M_dataplus._M_p == &local_48.name.field_2) {
      return;
    }
    uVar2 = local_48.name.field_2._M_allocated_capacity + 1;
    goto LAB_001fade9;
  }
  return;
}

Assistant:

void valueConvert(defV& val, DataType newType)
{
    auto index = val.index();
    switch (newType) {
        case DataType::HELICS_DOUBLE: {
            if (index == double_loc) {
                return;
            }
            double value{0};
            valueExtract(val, value);
            val = value;
            break;
        }
        case DataType::HELICS_INT: {
            if (index == int_loc) {
                return;
            }
            int64_t value{0};
            valueExtract(val, value);
            val = value;
            break;
        }
        case DataType::HELICS_TIME: {
            if (index == int_loc) {
                return;
            }
            Time value{timeZero};
            valueExtract(val, value);
            val = value.getBaseTimeCode();
            break;
        }
        case DataType::HELICS_JSON:
            break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            if (index == string_loc) {
                return;
            }
            std::string value;
            valueExtract(val, value);
            val = std::move(value);
            break;
        }
        case DataType::HELICS_VECTOR: {
            if (index == vector_loc) {
                return;
            }
            std::vector<double> vec;
            valueExtract(val, vec);
            val = std::move(vec);
            break;
        }
        case DataType::HELICS_COMPLEX: {
            if (index == complex_loc) {
                return;
            }
            std::complex<double> cval;
            valueExtract(val, cval);
            val = cval;
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            if (index == complex_vector_loc) {
                return;
            }
            std::vector<std::complex<double>> cvec;
            valueExtract(val, cvec);
            val = std::move(cvec);
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            if (index == named_point_loc) {
                return;
            }
            NamedPoint point;
            valueExtract(val, point);
            val = std::move(point);
            break;
        }
    }
}